

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_datadir::test_method(util_datadir *this)

{
  bool bVar1;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  path dd_norm;
  ArgsManager args;
  char *in_stack_fffffffffffff8f8;
  ArgsManager *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  ArgsManager *in_stack_fffffffffffff928;
  string *in_stack_fffffffffffff930;
  const_string *file;
  string *in_stack_fffffffffffff938;
  string *strArg;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  undefined1 local_638 [16];
  undefined1 local_628 [71];
  string local_5e1 [2];
  allocator<char> local_589;
  undefined1 local_588 [16];
  undefined1 local_578 [71];
  allocator<char> local_531;
  undefined1 local_530 [16];
  undefined1 local_520 [70];
  allocator<char> local_4da;
  allocator<char> local_4d9;
  undefined1 local_4d8 [272];
  undefined1 local_3c8 [272];
  undefined1 local_2b8 [688];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager((ArgsManager *)in_stack_fffffffffffff8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff948,
             (char *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             (allocator<char> *)in_stack_fffffffffffff938);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff900);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::allocator<char>::~allocator(&local_4d9);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff948,
             (char *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             (allocator<char> *)in_stack_fffffffffffff938);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff900);
  std::operator+(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::allocator<char>::~allocator(&local_4da);
  ArgsManager::ClearPathCache(in_stack_fffffffffffff928);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff938,
               (const_string *)in_stack_fffffffffffff930,(size_t)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff900,(char (*) [1])in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    ArgsManager::GetDataDirBase(in_stack_fffffffffffff900);
    in_stack_fffffffffffff908 = "args.GetDataDirBase()";
    in_stack_fffffffffffff900 = (ArgsManager *)(local_3c8 + 0x88);
    in_stack_fffffffffffff8f8 = "dd_norm";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_520,local_530,0x25,1,2,local_2b8);
    fs::path::~path((path *)in_stack_fffffffffffff8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff948,
             (char *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             (allocator<char> *)in_stack_fffffffffffff938);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff900);
  std::operator+(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::allocator<char>::~allocator(&local_531);
  ArgsManager::ClearPathCache(in_stack_fffffffffffff928);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff938,
               (const_string *)in_stack_fffffffffffff930,(size_t)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff900,(char (*) [1])in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    ArgsManager::GetDataDirBase(in_stack_fffffffffffff900);
    in_stack_fffffffffffff908 = "args.GetDataDirBase()";
    in_stack_fffffffffffff900 = (ArgsManager *)local_3c8;
    in_stack_fffffffffffff8f8 = "dd_norm";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_578,local_588,0x29,1,2,local_2b8);
    fs::path::~path((path *)in_stack_fffffffffffff8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff8f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff948,
             (char *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             (allocator<char> *)in_stack_fffffffffffff938);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff900);
  std::operator+(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::allocator<char>::~allocator(&local_589);
  ArgsManager::ClearPathCache(in_stack_fffffffffffff928);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff938,
               (const_string *)in_stack_fffffffffffff930,(size_t)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff900,(char (*) [1])in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    ArgsManager::GetDataDirBase(in_stack_fffffffffffff900);
    in_stack_fffffffffffff908 = "args.GetDataDirBase()";
    in_stack_fffffffffffff900 = (ArgsManager *)(local_4d8 + 0x88);
    in_stack_fffffffffffff8f8 = "dd_norm";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              ((undefined1 *)((long)&local_5e1[0].field_2 + 1),
               (undefined1 *)((long)&local_5e1[0]._M_dataplus._M_p + 1),0x2d,1,2,local_2b8);
    fs::path::~path((path *)in_stack_fffffffffffff8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff8f8);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  strArg = local_5e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffff940),(allocator<char> *)strArg);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff900);
  std::operator+(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(uVar2,in_stack_fffffffffffff940),strArg,
             in_stack_fffffffffffff930);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f8);
  std::allocator<char>::~allocator((allocator<char> *)local_5e1);
  ArgsManager::ClearPathCache(in_stack_fffffffffffff928);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)strArg,file,(size_t)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    in_stack_fffffffffffff928 = (ArgsManager *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff900,(char (*) [1])in_stack_fffffffffffff8f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff908,
               (pointer)in_stack_fffffffffffff900,(unsigned_long)in_stack_fffffffffffff8f8);
    ArgsManager::GetDataDirBase(in_stack_fffffffffffff900);
    in_stack_fffffffffffff908 = "args.GetDataDirBase()";
    in_stack_fffffffffffff900 = (ArgsManager *)local_4d8;
    in_stack_fffffffffffff8f8 = "dd_norm";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_628,local_638,0x31,1,2,local_2b8);
    fs::path::~path((path *)in_stack_fffffffffffff8f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff8f8);
    in_stack_fffffffffffff927 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff927);
  fs::path::~path((path *)in_stack_fffffffffffff8f8);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_fffffffffffff8f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_datadir)
{
    // Use local args variable instead of m_args to avoid making assumptions about test setup
    ArgsManager args;
    args.ForceSetArg("-datadir", fs::PathToString(m_path_root));

    const fs::path dd_norm = args.GetDataDirBase();

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/.");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/./");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());

    args.ForceSetArg("-datadir", fs::PathToString(dd_norm) + "/.//");
    args.ClearPathCache();
    BOOST_CHECK_EQUAL(dd_norm, args.GetDataDirBase());
}